

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O0

void __thiscall MessageHandler::handleNotification(MessageHandler *this,Document *message)

{
  bool bVar1;
  Type this_00;
  NotificationHandler **ppNVar2;
  optional<NotificationHandler_*> oVar3;
  undefined1 local_80 [8];
  optional<NotificationHandler_*> handler;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  params;
  char *method;
  Document *message_local;
  MessageHandler *this_local;
  
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)message,"method");
  params._16_8_ =
       rapidjson::
       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
       ::GetString(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"params",&local_59);
  getObject((optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
             *)local_38,message,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  oVar3 = HandlerManager::getNotificationHandler(this->handlers,(char *)params._16_8_);
  local_80 = (undefined1  [8])oVar3.value;
  handler.value._0_1_ = oVar3.is_some;
  bVar1 = ::optional::operator_cast_to_bool((optional *)local_80);
  if (bVar1) {
    ppNVar2 = optional<NotificationHandler_*>::operator*
                        ((optional<NotificationHandler_*> *)local_80);
    (*((*ppNVar2)->super_Handler)._vptr_Handler[1])(*ppNVar2,local_38);
  }
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~optional((optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               *)local_38);
  return;
}

Assistant:

void MessageHandler::handleNotification (Document &message) {
    const char *method = message["method"].GetString();

    optional<Value> params = getObject(message, "params");

    optional<NotificationHandler *> handler = handlers->getNotificationHandler(method);

    if (handler) {
        (*handler)->run(params);
    } else {
//        Not handling a notification is hardly exceptional
//        std::cerr << "Unhandled notification " << method << "\n";
    }
}